

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall
discordpp::GuildMember::GuildMember
          (GuildMember *this,omittable_field<discordpp::User> *user,
          nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *nick,nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *avatar,
          field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_> *roles,
          field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *joined_at,
          nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *premium_since,field<bool> *deaf,field<bool> *mute,field<int> *flags,
          omittable_field<bool> *pending,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *permissions,
          nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *communication_disabled_until)

{
  omittable_field<discordpp::User>::omittable_field(&this->user,user);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::nullable_omittable_field(&this->nick,nick);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::nullable_omittable_field(&this->avatar,avatar);
  field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>::field
            (&this->roles,roles);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->joined_at,joined_at);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::nullable_omittable_field(&this->premium_since,premium_since);
  field<bool>::field(&this->deaf,deaf);
  field<bool>::field(&this->mute,mute);
  field<int>::field(&this->flags,flags);
  omittable_field<bool>::omittable_field(&this->pending,pending);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->permissions,permissions);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::nullable_omittable_field(&this->communication_disabled_until,communication_disabled_until);
  return;
}

Assistant:

GuildMember(
        omittable_field<User> user = omitted,
        nullable_omittable_field<std::string> nick = omitted,
        nullable_omittable_field<std::string> avatar = omitted,
        field<std::vector<Snowflake> > roles = uninitialized,
        field<Timestamp> joined_at = uninitialized,
        nullable_omittable_field<Timestamp> premium_since = omitted,
        field<bool> deaf = uninitialized,
        field<bool> mute = uninitialized,
        field<int> flags = uninitialized,
        omittable_field<bool> pending = omitted,
        omittable_field<std::string> permissions = omitted,
        nullable_omittable_field<Timestamp> communication_disabled_until = omitted
    ):
        user(user),
        nick(nick),
        avatar(avatar),
        roles(roles),
        joined_at(joined_at),
        premium_since(premium_since),
        deaf(deaf),
        mute(mute),
        flags(flags),
        pending(pending),
        permissions(permissions),
        communication_disabled_until(communication_disabled_until)
    {}